

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetSpecsOf.hpp
# Opt level: O1

void __thiscall
sciplot::OffsetSpecsOf<sciplot::TicsSpecs>::OffsetSpecsOf
          (OffsetSpecsOf<sciplot::TicsSpecs> *this,void **vtt)

{
  void *pvVar1;
  char *__end;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->xoffset)._M_dataplus._M_p = (pointer)&(this->xoffset).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->xoffset,"0","");
  (this->yoffset)._M_dataplus._M_p = (pointer)&(this->yoffset).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->yoffset,"0","");
  return;
}

Assistant:

OffsetSpecsOf<DerivedSpecs>::OffsetSpecsOf()
{
}